

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktQueryPoolOcclusionTests.cpp
# Opt level: O1

void __thiscall
vkt::QueryPool::anon_unknown_0::
QueryPoolOcclusionTest<vkt::QueryPool::(anonymous_namespace)::BasicOcclusionQueryTestInstance>::
QueryPoolOcclusionTest
          (QueryPoolOcclusionTest<vkt::QueryPool::(anonymous_namespace)::BasicOcclusionQueryTestInstance>
           *this,TestContext *context,char *name,char *description,
          OcclusionQueryTestVector *testVector)

{
  VkDeviceSize VVar1;
  OcclusionQueryResultSize OVar2;
  OcclusionQueryWait OVar3;
  OcclusionQueryResultsMode OVar4;
  bool bVar5;
  undefined3 uVar6;
  VkPrimitiveTopology VVar7;
  allocator<char> local_62;
  allocator<char> local_61;
  long *local_60 [2];
  long local_50 [2];
  long *local_40 [2];
  long local_30 [2];
  
  std::__cxx11::string::string<std::allocator<char>>((string *)local_40,name,&local_61);
  std::__cxx11::string::string<std::allocator<char>>((string *)local_60,description,&local_62);
  tcu::TestCase::TestCase((TestCase *)this,context,(char *)local_40[0],(char *)local_60[0]);
  (this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__TestCase_00d4f460;
  if (local_60[0] != local_50) {
    operator_delete(local_60[0],local_50[0] + 1);
  }
  if (local_40[0] != local_30) {
    operator_delete(local_40[0],local_30[0] + 1);
  }
  (this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__TestCase_00d5fad8;
  OVar2 = testVector->queryResultSize;
  OVar3 = testVector->queryWait;
  OVar4 = testVector->queryResultsMode;
  VVar1 = testVector->queryResultsStride;
  bVar5 = testVector->queryResultsAvailability;
  uVar6 = *(undefined3 *)&testVector->field_0x19;
  VVar7 = testVector->primitiveTopology;
  (this->m_testVector).queryControlFlags = testVector->queryControlFlags;
  (this->m_testVector).queryResultSize = OVar2;
  (this->m_testVector).queryWait = OVar3;
  (this->m_testVector).queryResultsMode = OVar4;
  (this->m_testVector).queryResultsStride = VVar1;
  (this->m_testVector).queryResultsAvailability = bVar5;
  *(undefined3 *)&(this->m_testVector).field_0x19 = uVar6;
  (this->m_testVector).primitiveTopology = VVar7;
  return;
}

Assistant:

QueryPoolOcclusionTest (tcu::TestContext &context, const char *name, const char *description, const OcclusionQueryTestVector& testVector)
		: TestCase			(context, name, description)
		, m_testVector		(testVector)
	{
	}